

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

HRESULT __thiscall
Js::ScriptContext::RecreateNativeCodeGenerator
          (ScriptContext *this,NativeCodeGenerator **previousCodeGen)

{
  BOOL fSet;
  NativeCodeGenerator *pNVar1;
  OutOfMemoryException anon_var_0;
  AutoNestedHandledExceptionType local_28;
  HRESULT local_24;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  HRESULT hr;
  NativeCodeGenerator *oldCodeGen;
  NativeCodeGenerator **previousCodeGen_local;
  ScriptContext *this_local;
  
  ___autoNestedHandledExceptionType = this->nativeCodeGen;
  local_24 = 0;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_28,ExceptionType_OutOfMemory);
  pNVar1 = NewNativeCodeGenerator(this);
  this->nativeCodeGen = pNVar1;
  pNVar1 = GetNativeCodeGenerator(this);
  fSet = IsProfiling(this);
  SetProfileModeNativeCodeGen(pNVar1,fSet);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_28);
  CloseNativeCodeGenerator(___autoNestedHandledExceptionType);
  if (previousCodeGen == (NativeCodeGenerator **)0x0) {
    DeleteNativeCodeGenerator(___autoNestedHandledExceptionType);
  }
  else {
    *previousCodeGen = ___autoNestedHandledExceptionType;
  }
  return local_24;
}

Assistant:

HRESULT ScriptContext::RecreateNativeCodeGenerator(NativeCodeGenerator ** previousCodeGen)
    {
        NativeCodeGenerator* oldCodeGen = this->nativeCodeGen;

        HRESULT hr = S_OK;
        BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
        this->nativeCodeGen = NewNativeCodeGenerator(this);
        SetProfileModeNativeCodeGen(this->GetNativeCodeGenerator(), this->IsProfiling());
        END_TRANSLATE_OOM_TO_HRESULT(hr);

        // Delete the native code generator and recreate so that all jobs get cleared properly
        // and re-jitted.
        CloseNativeCodeGenerator(oldCodeGen);
        if (previousCodeGen == nullptr)
        {
            DeleteNativeCodeGenerator(oldCodeGen);
        }
        else
        {
            *previousCodeGen = oldCodeGen;
        }

        return hr;
    }